

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int codeTriggerProgram(Parse *pParse,TriggerStep *pStepList,int orconf)

{
  char cVar1;
  Vdbe *p;
  SrcList *pSVar2;
  ExprList *pChanges;
  Expr *pEVar3;
  IdList *pColumn;
  Select *pSVar4;
  u8 local_64;
  Select *pSelect;
  SelectDest sDest;
  sqlite3 *db;
  Vdbe *v;
  TriggerStep *pStep;
  int orconf_local;
  TriggerStep *pStepList_local;
  Parse *pParse_local;
  
  p = pParse->pVdbe;
  sDest.pOrderBy = (ExprList *)pParse->db;
  for (v = (Vdbe *)pStepList; v != (Vdbe *)0x0; v = *(Vdbe **)&v->rc) {
    if (orconf == 10) {
      local_64 = *(u8 *)((long)&v->db + 1);
    }
    else {
      local_64 = (u8)orconf;
    }
    pParse->eOrconf = local_64;
    cVar1 = *(char *)&v->db;
    if (cVar1 == 'l') {
      pSVar2 = targetSrcList(pParse,(TriggerStep *)v);
      pSVar4 = sqlite3SelectDup((sqlite3 *)sDest.pOrderBy,(Select *)v->pNext,0);
      pColumn = sqlite3IdListDup((sqlite3 *)sDest.pOrderBy,*(IdList **)&v->cacheCtr);
      sqlite3Insert(pParse,pSVar2,pSVar4,pColumn,(uint)pParse->eOrconf);
    }
    else if (cVar1 == 'm') {
      pSVar2 = targetSrcList(pParse,(TriggerStep *)v);
      pEVar3 = sqlite3ExprDup((sqlite3 *)sDest.pOrderBy,*(Expr **)&v->nVar,0);
      sqlite3DeleteFrom(pParse,pSVar2,pEVar3);
    }
    else if (cVar1 == 'n') {
      pSVar2 = targetSrcList(pParse,(TriggerStep *)v);
      pChanges = sqlite3ExprListDup((sqlite3 *)sDest.pOrderBy,*(ExprList **)&v->nMem,0);
      pEVar3 = sqlite3ExprDup((sqlite3 *)sDest.pOrderBy,*(Expr **)&v->nVar,0);
      sqlite3Update(pParse,pSVar2,pChanges,pEVar3,(uint)pParse->eOrconf);
    }
    else {
      pSVar4 = sqlite3SelectDup((sqlite3 *)sDest.pOrderBy,(Select *)v->pNext,0);
      sqlite3SelectDestInit((SelectDest *)&pSelect,4,0);
      sqlite3Select(pParse,pSVar4,(SelectDest *)&pSelect);
      sqlite3SelectDelete((sqlite3 *)sDest.pOrderBy,pSVar4);
    }
    if (*(char *)&v->db != 'w') {
      sqlite3VdbeAddOp0(p,0x77);
    }
  }
  return 0;
}

Assistant:

static int codeTriggerProgram(
  Parse *pParse,            /* The parser context */
  TriggerStep *pStepList,   /* List of statements inside the trigger body */
  int orconf                /* Conflict algorithm. (OE_Abort, etc) */  
){
  TriggerStep *pStep;
  Vdbe *v = pParse->pVdbe;
  sqlite3 *db = pParse->db;

  assert( pParse->pTriggerTab && pParse->pToplevel );
  assert( pStepList );
  assert( v!=0 );
  for(pStep=pStepList; pStep; pStep=pStep->pNext){
    /* Figure out the ON CONFLICT policy that will be used for this step
    ** of the trigger program. If the statement that caused this trigger
    ** to fire had an explicit ON CONFLICT, then use it. Otherwise, use
    ** the ON CONFLICT policy that was specified as part of the trigger
    ** step statement. Example:
    **
    **   CREATE TRIGGER AFTER INSERT ON t1 BEGIN;
    **     INSERT OR REPLACE INTO t2 VALUES(new.a, new.b);
    **   END;
    **
    **   INSERT INTO t1 ... ;            -- insert into t2 uses REPLACE policy
    **   INSERT OR IGNORE INTO t1 ... ;  -- insert into t2 uses IGNORE policy
    */
    pParse->eOrconf = (orconf==OE_Default)?pStep->orconf:(u8)orconf;
    assert( pParse->okConstFactor==0 );

    switch( pStep->op ){
      case TK_UPDATE: {
        sqlite3Update(pParse, 
          targetSrcList(pParse, pStep),
          sqlite3ExprListDup(db, pStep->pExprList, 0), 
          sqlite3ExprDup(db, pStep->pWhere, 0), 
          pParse->eOrconf
        );
        break;
      }
      case TK_INSERT: {
        sqlite3Insert(pParse, 
          targetSrcList(pParse, pStep),
          sqlite3SelectDup(db, pStep->pSelect, 0), 
          sqlite3IdListDup(db, pStep->pIdList), 
          pParse->eOrconf
        );
        break;
      }
      case TK_DELETE: {
        sqlite3DeleteFrom(pParse, 
          targetSrcList(pParse, pStep),
          sqlite3ExprDup(db, pStep->pWhere, 0)
        );
        break;
      }
      default: assert( pStep->op==TK_SELECT ); {
        SelectDest sDest;
        Select *pSelect = sqlite3SelectDup(db, pStep->pSelect, 0);
        sqlite3SelectDestInit(&sDest, SRT_Discard, 0);
        sqlite3Select(pParse, pSelect, &sDest);
        sqlite3SelectDelete(db, pSelect);
        break;
      }
    } 
    if( pStep->op!=TK_SELECT ){
      sqlite3VdbeAddOp0(v, OP_ResetCount);
    }
  }

  return 0;
}